

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_c_string(sexp ctx,char *str,sexp_sint_t slen)

{
  size_t in_RDX;
  char *in_RSI;
  sexp s;
  sexp_sint_t len;
  sexp in_stack_00000030;
  sexp in_stack_00000038;
  size_t local_38;
  sexp local_8;
  
  if (in_RSI == (char *)0x0) {
    local_8 = (sexp)&DAT_0000003e;
  }
  else {
    local_38 = in_RDX;
    if ((long)in_RDX < 0) {
      local_38 = strlen(in_RSI);
    }
    local_8 = sexp_make_string_op(in_stack_00000038,in_stack_00000030,(sexp_sint_t)ctx,(sexp)str,
                                  (sexp)slen);
    if ((((ulong)local_8 & 3) != 0) || (local_8->tag != 0x13)) {
      memcpy((((local_8->value).type.name)->value).flonum_bits + 8 + (long)(local_8->value).type.cpl
             ,in_RSI,local_38);
      ((((local_8->value).type.name)->value).flonum_bits + 8 + (long)(local_8->value).type.cpl)
      [local_38] = '\0';
    }
  }
  return local_8;
}

Assistant:

sexp sexp_c_string (sexp ctx, const char *str, sexp_sint_t slen) {
  sexp_sint_t len;
  sexp s;
  if (str == NULL) return SEXP_FALSE;
  len = ((slen >= 0) ? slen : strlen(str));
  s = sexp_make_string(ctx, sexp_make_fixnum(len), SEXP_VOID);
  if (sexp_exceptionp(s)) return s;
  memcpy(sexp_string_data(s), str, len);
  sexp_string_data(s)[len] = '\0';
  sexp_update_string_index_lookup(ctx, s);
  return s;
}